

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.h
# Opt level: O1

double Js::DateImplementation::GetTvUtc<Js::ScriptContext>(double tv,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double value;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/DateImplementation.h"
                                ,0x13c,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = NumberUtilities::IsNan(tv);
  if ((!bVar2) && (bVar2 = NumberUtilities::IsFinite(tv), bVar2)) {
    value = PlatformAgnostic::DateTime::DaylightTimeHelper::LocalToUtc
                      (&scriptContext->daylightTimeHelper,tv);
    bVar2 = NumberUtilities::IsNan(value);
    if ((!bVar2) &&
       (((bVar2 = NumberUtilities::IsFinite(tv), value <= 8.64e+15 && (-8.64e+15 <= value)) &&
        (bVar2)))) {
      return value;
    }
  }
  return NAN;
}

Assistant:

double DateImplementation::GetTvUtc(double tv, ScriptContext *scriptContext)
    {
        Assert(scriptContext);

        double tvUtc;

        if (JavascriptNumber::IsNan(tv) || !NumberUtilities::IsFinite(tv))
        {
            return JavascriptNumber::NaN;
        }

        tvUtc = scriptContext->GetDaylightTimeHelper()->LocalToUtc(tv);
        // See if we're out of range after conversion (UTC time value must be within this range)
        if (JavascriptNumber::IsNan(tvUtc) || !NumberUtilities::IsFinite(tv) || tvUtc < ktvMin || tvUtc > ktvMax)
        {
            return JavascriptNumber::NaN;
        }
        return tvUtc;
    }